

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleUVFilterCols_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x,int dx)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  for (lVar1 = 0; iVar2 = x >> 0x10, (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    uVar3 = (uint)x >> 9 & 0x7f;
    *(ushort *)(dst_uv + lVar1 * 2) =
         (ushort)((*(ushort *)(src_uv + (long)iVar2 * 2 + 2) & 0xff) * uVar3 +
                  (*(ushort *)(src_uv + (long)iVar2 * 2) & 0xff) * (uVar3 ^ 0x7f) >> 7) |
         ((*(ushort *)(src_uv + (long)iVar2 * 2 + 2) >> 8) * (short)uVar3 +
         (*(ushort *)(src_uv + (long)iVar2 * 2) >> 8) * (short)(uVar3 ^ 0x7f)) * 2 & 0xff00;
    uVar3 = x + dx;
    uVar4 = uVar3 >> 9 & 0x7f;
    *(ushort *)(dst_uv + lVar1 * 2 + 2) =
         (ushort)((*(ushort *)(src_uv + (long)((int)uVar3 >> 0x10) * 2 + 2) & 0xff) * uVar4 +
                  (*(ushort *)(src_uv + (long)((int)uVar3 >> 0x10) * 2) & 0xff) * (uVar4 ^ 0x7f) >>
                 7) |
         ((*(ushort *)(src_uv + (long)((int)uVar3 >> 0x10) * 2 + 2) >> 8) * (short)uVar4 +
         (*(ushort *)(src_uv + (long)((int)uVar3 >> 0x10) * 2) >> 8) * (short)(uVar4 ^ 0x7f)) * 2 &
         0xff00;
    x = uVar3 + dx;
  }
  if ((dst_width & 1U) != 0) {
    uVar3 = (uint)x >> 9 & 0x7f;
    *(ushort *)(dst_uv + lVar1 * 2) =
         (ushort)((*(ushort *)(src_uv + (long)iVar2 * 2 + 2) & 0xff) * uVar3 +
                  (*(ushort *)(src_uv + (long)iVar2 * 2) & 0xff) * (uVar3 ^ 0x7f) >> 7) |
         ((*(ushort *)(src_uv + (long)iVar2 * 2 + 2) >> 8) * (short)uVar3 +
         (*(ushort *)(src_uv + (long)iVar2 * 2) >> 8) * (short)(uVar3 ^ 0x7f)) * 2 & 0xff00;
  }
  return;
}

Assistant:

void ScaleUVFilterCols_C(uint8_t* dst_uv,
                         const uint8_t* src_uv,
                         int dst_width,
                         int x,
                         int dx) {
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}